

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<const_BayesianGameForDecPOMDPStage> * __thiscall
boost::shared_ptr<BayesianGameForDecPOMDPStage_const>::operator=
          (shared_ptr<const_BayesianGameForDecPOMDPStage> *this,
          shared_ptr<BayesianGameForDecPOMDPStage> *r)

{
  undefined8 in_RSI;
  shared_ptr<const_BayesianGameForDecPOMDPStage> *in_RDI;
  shared_ptr<const_BayesianGameForDecPOMDPStage> *in_stack_ffffffffffffffc8;
  shared_ptr<const_BayesianGameForDecPOMDPStage> local_20 [2];
  
  shared_ptr<const_BayesianGameForDecPOMDPStage>::shared_ptr<BayesianGameForDecPOMDPStage>
            (local_20,in_RSI);
  shared_ptr<const_BayesianGameForDecPOMDPStage>::swap(in_RDI,in_stack_ffffffffffffffc8);
  shared_ptr<const_BayesianGameForDecPOMDPStage>::~shared_ptr
            ((shared_ptr<const_BayesianGameForDecPOMDPStage> *)0x9678d0);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr<Y> && r ) BOOST_NOEXCEPT
    {
        this_type( static_cast< shared_ptr<Y> && >( r ) ).swap( *this );
        return *this;
    }